

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.c
# Opt level: O2

void * run(void *args_abs)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  wasm_valtype_t *pwVar5;
  undefined8 uVar6;
  long lVar7;
  long lVar8;
  char *__s;
  int iVar9;
  bool bVar10;
  wasm_extern_t *imports [2];
  wasm_extern_vec_t exports;
  wasm_val_t val;
  
  uVar1 = wasm_store_new(*args_abs);
  uVar2 = wasm_module_obtain(uVar1,*(undefined8 *)((long)args_abs + 8));
  iVar9 = 3;
  while( true ) {
    bVar10 = iVar9 == 0;
    iVar9 = iVar9 + -1;
    if (bVar10) {
      wasm_module_delete(uVar2);
      wasm_store_delete(uVar1);
      free(args_abs);
      return (void *)0x0;
    }
    usleep(100000);
    exports.size = (size_t)wasm_valtype_new_i32();
    wasm_valtype_vec_new(&val,1,&exports);
    wasm_valtype_vec_new_empty(imports);
    uVar3 = wasm_functype_new(&val,imports);
    uVar4 = wasm_func_new(uVar1,uVar3,callback);
    wasm_functype_delete(uVar3);
    val.kind = '\0';
    val.of.i32 = *(int32_t *)((long)args_abs + 0x10);
    pwVar5 = wasm_valtype_new_i32();
    uVar3 = wasm_globaltype_new(pwVar5,0);
    uVar6 = wasm_global_new(uVar1,uVar3,&val);
    wasm_globaltype_delete(uVar3);
    imports[0] = (wasm_extern_t *)wasm_func_as_extern(uVar4);
    imports[1] = (wasm_extern_t *)wasm_global_as_extern(uVar6);
    lVar7 = wasm_instance_new(uVar1,uVar2,imports,0);
    if (lVar7 == 0) break;
    wasm_func_delete(uVar4);
    wasm_global_delete(uVar6);
    wasm_instance_exports(lVar7,&exports);
    if (exports.size == 0) {
      __s = "> Error accessing exports!";
      goto LAB_001025dd;
    }
    lVar8 = wasm_extern_as_func(*exports.data);
    if (lVar8 == 0) {
      __s = "> Error accessing export!";
      goto LAB_001025dd;
    }
    wasm_instance_delete(lVar7);
    lVar7 = wasm_func_call(lVar8,0,0);
    if (lVar7 != 0) {
      __s = "> Error calling function!";
      goto LAB_001025dd;
    }
    wasm_extern_vec_delete(&exports);
  }
  __s = "> Error instantiating module!";
LAB_001025dd:
  puts(__s);
  return (void *)0x0;
}

Assistant:

void* run(void* args_abs) {
  thread_args* args = (thread_args*)args_abs;

  // Rereate store and module.
  own wasm_store_t* store = wasm_store_new(args->engine);
  own wasm_module_t* module = wasm_module_obtain(store, args->module);

  // Run the example N times.
  for (int i = 0; i < N_REPS; ++i) {
    usleep(100000);

    // Create imports.
    own wasm_functype_t* func_type = wasm_functype_new_1_0(wasm_valtype_new_i32());
    own wasm_func_t* func = wasm_func_new(store, func_type, callback);
    wasm_functype_delete(func_type);

    wasm_val_t val = {.kind = WASM_I32, .of = {.i32 = (int32_t)args->id}};
    own wasm_globaltype_t* global_type =
      wasm_globaltype_new(wasm_valtype_new_i32(), WASM_CONST);
    own wasm_global_t* global = wasm_global_new(store, global_type, &val);
    wasm_globaltype_delete(global_type);

    // Instantiate.
    const wasm_extern_t* imports[] = {
      wasm_func_as_extern(func), wasm_global_as_extern(global),
    };
    own wasm_instance_t* instance =
      wasm_instance_new(store, module, imports, NULL);
    if (!instance) {
      printf("> Error instantiating module!\n");
      return NULL;
    }

    wasm_func_delete(func);
    wasm_global_delete(global);

    // Extract export.
    own wasm_extern_vec_t exports;
    wasm_instance_exports(instance, &exports);
    if (exports.size == 0) {
      printf("> Error accessing exports!\n");
      return NULL;
    }
    const wasm_func_t *run_func = wasm_extern_as_func(exports.data[0]);
    if (run_func == NULL) {
      printf("> Error accessing export!\n");
      return NULL;
    }

    wasm_instance_delete(instance);

    // Call.
    if (wasm_func_call(run_func, NULL, NULL)) {
      printf("> Error calling function!\n");
      return NULL;
    }

    wasm_extern_vec_delete(&exports);
  }

  wasm_module_delete(module);
  wasm_store_delete(store);

  free(args_abs);

  return NULL;
}